

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall QMap<Qt::MouseButton,_QPointF>::clear(QMap<Qt::MouseButton,_QPointF> *this)

{
  QMapData<std::map<Qt::MouseButton,_QPointF,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPointF>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<Qt::MouseButton,_QPointF,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPointF>_>_>_>
                 *)0x0) {
    return;
  }
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1) {
    std::
    _Rb_tree<Qt::MouseButton,_std::pair<const_Qt::MouseButton,_QPointF>,_std::_Select1st<std::pair<const_Qt::MouseButton,_QPointF>_>,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPointF>_>_>
    ::clear(&(pQVar1->m)._M_t);
    return;
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::MouseButton,_QPointF,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPointF>_>_>_>_>
  ::reset(&this->d,(QMapData<std::map<Qt::MouseButton,_QPointF,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPointF>_>_>_>
                    *)0x0);
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }